

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcRationalBezierCurve::IfcRationalBezierCurve
          (IfcRationalBezierCurve *this)

{
  *(undefined ***)&this->field_0xe8 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0xf0 = 0;
  *(char **)&this->field_0xf8 = "IfcRationalBezierCurve";
  IfcBezierCurve::IfcBezierCurve((IfcBezierCurve *)this,&PTR_construction_vtable_24__0081b068);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRationalBezierCurve,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x81af38;
  *(undefined8 *)&this->field_0xe8 = 0x81b050;
  *(undefined8 *)&this->field_0x10 = 0x81af60;
  *(undefined8 *)&this->field_0x20 = 0x81af88;
  *(undefined8 *)&this->field_0x30 = 0x81afb0;
  *(undefined8 *)&this->field_0x40 = 0x81afd8;
  *(undefined8 *)&this->field_0xb0 = 0x81b000;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRationalBezierCurve,_1UL>).
  _vptr_ObjectHelper = (_func_int **)0x81b028;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRationalBezierCurve,_1UL>).field_0x10 = 0;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRationalBezierCurve,_1UL>).field_0x18 = 0;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRationalBezierCurve,_1UL>).field_0x20 = 0;
  return;
}

Assistant:

IfcRationalBezierCurve() : Object("IfcRationalBezierCurve") {}